

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<QFuture<QString>>::
     call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>,tst_helpers_attempt::futureResult()::__0>
               (QPromiseReject<QString> *resolve,QPromiseReject<QString> *reject)

{
  QFuture<QString> local_30;
  QPromiseReject<QString> *local_20;
  QPromiseReject<QString> *reject_local;
  QPromiseResolve<QString> *resolve_local;
  
  local_20 = reject;
  reject_local = resolve;
  tst_helpers_attempt::futureResult::anon_class_1_0_00000001::operator()
            (&local_30,(anon_class_1_0_00000001 *)((long)&resolve_local + 7));
  PromiseFulfill<QFuture<QString>_>::call
            (&local_30,(QPromiseResolve<QString> *)reject_local,local_20);
  QFuture<QString>::~QFuture(&local_30);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }